

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O0

void __thiscall Node::FindAdd(Node *this,char *part,bool *done,Node **newNode)

{
  Node *pNVar1;
  bool bVar2;
  char *local_40;
  char *tmp2;
  char *tmp1;
  Node **nx;
  Node **newNode_local;
  bool *done_local;
  char *part_local;
  Node *this_local;
  
  if (((*done & 1U) == 0) && (tmp2 = this->uri, local_40 = part, *tmp2 == *part)) {
    while( true ) {
      bVar2 = false;
      if (*tmp2 != '\0') {
        bVar2 = *local_40 != '\0';
      }
      if (!bVar2) {
        if (*local_40 == '\0') {
          pNVar1 = Add(this,this->uri,part);
          *newNode = pNVar1;
          *done = true;
          return;
        }
        if (this->next != (Node **)0x0) {
          for (tmp1 = (char *)this->next; *(long *)tmp1 != 0; tmp1 = tmp1 + 8) {
            FindAdd(*(Node **)tmp1,local_40,done,newNode);
            if ((*done & 1U) != 0) {
              return;
            }
          }
        }
        pNVar1 = Add(this,tmp2,local_40);
        *newNode = pNVar1;
        *done = true;
        return;
      }
      if (*tmp2 != *local_40) break;
      tmp2 = tmp2 + 1;
      local_40 = local_40 + 1;
    }
    pNVar1 = Add(this,tmp2,local_40);
    *newNode = pNVar1;
    *done = true;
  }
  return;
}

Assistant:

void Node::FindAdd(const char* part, bool *done, class Node ** newNode) {
	if (*done)
		return;
	class Node **nx;
	char *tmp1;
	const char *tmp2;

	tmp1 = uri;
	tmp2 = part;


	//first character is different, we are not interested by this node
	if (*tmp1 != *tmp2)
		return;


//
//	if ( strcmp(tmp1,tmp2) == 0) {
//		*newNode = Add(tmp1, tmp2);
//		*done = true;
//		return;
//	}


//	cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
	while (*tmp1 && *tmp2) {
//		cerr << "----->1aaa tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (*tmp1 == *tmp2) {
			tmp1++;
			tmp2++;
		} else {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl ;
			*newNode = Add(tmp1, tmp2);
			*done = true;
//			if (*newNode == NULL) {cerr << "-----> 1 uposss" << done << endl ; }
			return;
		}
	}

//	cerr << "part: " << part << endl;

	if (*tmp2 != '\0') {
//		cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (next) {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
			nx = next;
			while (*nx != NULL) {
				(*nx)->FindAdd(tmp2, done, newNode);
				if (*done) {
					return;
				}
				nx++;
			}
		}

//		cerr << "----->1 tmp3 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		*newNode = Add(tmp1, tmp2);
		//	if (*newNode == NULL) {cerr << "-----> 3 uposss" << done << endl ; }
		*done = true;
	} else {
//		cerr << "----->3 tmp1 & tmp2: " << uri  << "\t" << part << endl ;
		//if (leaf == NULL) {
//			cerr << "1" << endl;
		*newNode = Add(uri, part);
		*done = true;
//		} else {
//			cerr << "2" << endl;
//			*newNode = this;
//			*done = true;
//		}
	}

}